

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateStackLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  LayerUnion LVar5;
  LogMessage *other;
  long *plVar6;
  size_type *psVar7;
  string err;
  Result r;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  Result::Result((Result *)&local_50);
  validateInputCount((Result *)local_a8,layer,2,-1);
  local_50 = (size_type *)local_a8;
  std::__cxx11::string::operator=((string *)&local_48,(string *)&local_a0);
  if (local_a0._M_p != local_98 + 8) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_50);
  if (bVar4) {
    validateOutputCount((Result *)local_a8,layer,1,1);
    local_50 = (size_type *)local_a8;
    std::__cxx11::string::operator=((string *)&local_48,(string *)&local_a0);
    if (local_a0._M_p != local_98 + 8) {
      operator_delete(local_a0._M_p,local_98._8_8_ + 1);
    }
  }
  if (layer->_oneof_case_[0] == 0x39d) {
    LVar5 = layer->layer_;
  }
  else {
    LVar5.stack_ = Specification::StackLayerParams::default_instance();
  }
  iVar2 = (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 < 1) {
LAB_0053c4d2:
    *(size_type **)__return_storage_ptr__ = local_50;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_p == &local_38) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_38._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_48._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_40;
    local_40 = 0;
    local_38._M_local_buf[0] = '\0';
    local_48._M_p = (pointer)&local_38;
  }
  else {
    uVar3 = *(uint *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                     0x24);
    if (iVar2 == 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_a8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    }
    if (uVar3 == *(uint *)(*(long *)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_ + 1) +
                          0x24)) {
      if (((long)(int)~uVar3 <= (long)((LVar5.activation_)->NonlinearityType_).linear_) &&
         ((long)((LVar5.activation_)->NonlinearityType_).linear_ < (long)(int)uVar3 + 1))
      goto LAB_0053c4d2;
      std::operator+(&local_70,
                     "Value of axis must be in the range [-rank(tensor), rank(tensor)] for \'",
                     (layer->name_).ptr_);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_a8 = (undefined1  [8])local_98;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        local_98._0_8_ = *psVar7;
        local_98._8_8_ = plVar6[3];
      }
      else {
        local_98._0_8_ = *psVar7;
        local_a8 = (undefined1  [8])*plVar6;
      }
      local_a0._M_p = (pointer)plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
    }
    else {
      std::operator+(&local_70,"Shapes of all inputs must match for \'",(layer->name_).ptr_);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_a8 = (undefined1  [8])local_98;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar7) {
        local_98._0_8_ = *psVar7;
        local_98._8_8_ = plVar6[3];
      }
      else {
        local_98._0_8_ = *psVar7;
        local_a8 = (undefined1  [8])*plVar6;
      }
      local_a0._M_p = (pointer)plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_a8);
    }
    if (local_a8 != (undefined1  [8])local_98) {
      operator_delete((void *)local_a8,local_98._0_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,
                    CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateStackLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 2, -1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    const auto& params = layer.stack();
    if (layer.inputtensor_size() > 0) {
        const int rank0 = static_cast<int>(layer.inputtensor(0).rank());
        const int rank1 = static_cast<int>(layer.inputtensor(1).rank());
        if (rank0 != rank1) {
            const std::string err = "Shapes of all inputs must match for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        if (!(params.axis() >= -(rank0 + 1) && params.axis() < rank0 + 1)) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)] for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    return r;
}